

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

bool ON_MeshTriangle_GetTriangleNormal(double *p,double *q,double *r,ON_3dVector *triangle_normal)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar2 = *r - *p;
  dVar6 = r[1] - p[1];
  dVar7 = r[2] - p[2];
  dVar5 = p[1] - q[1];
  dVar3 = p[2] - q[2];
  dVar4 = *p - *q;
  triangle_normal->x = dVar6 * dVar3 - dVar7 * dVar5;
  triangle_normal->y = dVar7 * dVar4 - dVar2 * dVar3;
  triangle_normal->z = dVar5 * dVar2 - dVar4 * dVar6;
  bVar1 = ON_3dVector::Unitize(triangle_normal);
  return bVar1;
}

Assistant:

static bool ON_MeshTriangle_GetTriangleNormal(
   const double* p,
   const double* q,
   const double* r,
   class ON_3dVector& triangle_normal
  )
{
  const double a[3] = {r[0]-p[0],r[1]-p[1],r[2]-p[2]};
  const double b[3] = {p[0]-q[0],p[1]-q[1],p[2]-q[2]};

  triangle_normal.x = a[1]*b[2] - b[1]*a[2];
  triangle_normal.y = a[2]*b[0] - b[2]*a[0];
  triangle_normal.z = a[0]*b[1] - b[0]*a[1];
  return triangle_normal.Unitize();
}